

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O0

session_config * rudp::operator&=(session_config *l,session_config *r)

{
  unsigned_short *puVar1;
  uchar *puVar2;
  session_config *r_local;
  session_config *l_local;
  
  puVar1 = std::min<unsigned_short>
                     (&l->retransmission_timeout_value,&r->retransmission_timeout_value);
  l->retransmission_timeout_value = *puVar1;
  puVar1 = std::min<unsigned_short>
                     (&l->cumulative_ack_timeout_value,&r->cumulative_ack_timeout_value);
  l->cumulative_ack_timeout_value = *puVar1;
  puVar1 = std::min<unsigned_short>(&l->null_segment_timeout_value,&r->null_segment_timeout_value);
  l->null_segment_timeout_value = *puVar1;
  puVar1 = std::min<unsigned_short>
                     (&l->transfer_state_timeout_value,&r->transfer_state_timeout_value);
  l->transfer_state_timeout_value = *puVar1;
  puVar2 = std::min<unsigned_char>(&l->max_retrans,&r->max_retrans);
  l->max_retrans = *puVar2;
  puVar2 = std::min<unsigned_char>(&l->max_cum_ack,&r->max_cum_ack);
  l->max_cum_ack = *puVar2;
  puVar2 = std::min<unsigned_char>(&l->max_out_of_seq,&r->max_out_of_seq);
  l->max_out_of_seq = *puVar2;
  puVar2 = std::min<unsigned_char>(&l->max_auto_reset,&r->max_auto_reset);
  l->max_auto_reset = *puVar2;
  return l;
}

Assistant:

session_config &operator&=( session_config &l, const session_config &r ) {
  l.retransmission_timeout_value = std::min( l.retransmission_timeout_value, r.retransmission_timeout_value );
  l.cumulative_ack_timeout_value = std::min( l.cumulative_ack_timeout_value, r.cumulative_ack_timeout_value );
  l.null_segment_timeout_value = std::min( l.null_segment_timeout_value, r.null_segment_timeout_value );
  l.transfer_state_timeout_value = std::min( l.transfer_state_timeout_value, r.transfer_state_timeout_value );
  l.max_retrans = std::min( l.max_retrans, r.max_retrans );
  l.max_cum_ack = std::min( l.max_cum_ack, r.max_cum_ack );
  l.max_out_of_seq = std::min( l.max_out_of_seq, r.max_out_of_seq );
  l.max_auto_reset = std::min( l.max_auto_reset, r.max_auto_reset );
  return l;
}